

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O1

EGLImageKHR __thiscall deqp::egl::anon_unknown_0::TestContext::createEGLImage(TestContext *this)

{
  int iVar1;
  deUint32 err;
  GLenum err_00;
  Library *pLVar2;
  undefined4 extraout_var;
  GLuint sourceTexture;
  EGLint attribList [3];
  uint local_2c [5];
  
  local_2c[0] = anon_unknown_5::createTexture(&this->m_gl,&this->m_config);
  pLVar2 = EglTestContext::getLibrary(this->m_testCtx);
  local_2c[3] = 0x3038;
  local_2c[1] = 0x30bc;
  local_2c[2] = 0;
  iVar1 = (*pLVar2->_vptr_Library[8])
                    (pLVar2,this->m_eglDisplay,this->m_eglContext,0x30b1,(ulong)local_2c[0]);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"eglCreateImageKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                   ,0x25d);
  (*(this->m_gl).deleteTextures)(1,local_2c);
  err_00 = (*(this->m_gl).getError)();
  glu::checkError(err_00,"eglCreateImageKHR()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x260);
  return (EGLImageKHR)CONCAT44(extraout_var,iVar1);
}

Assistant:

EGLImageKHR TestContext::createEGLImage (void)
{
	GLuint sourceTexture = createTexture(m_gl, m_config);

	try
	{
		const Library&	egl				= m_testCtx.getLibrary();
		const EGLint	attribList[]	=
		{
			EGL_GL_TEXTURE_LEVEL_KHR, 0,
			EGL_NONE
		};

		EGLImageKHR image = egl.createImageKHR(m_eglDisplay, m_eglContext, EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)sourceTexture, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateImageKHR()");

		m_gl.deleteTextures(1, &sourceTexture);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "eglCreateImageKHR()");

		return image;
	}
	catch (...)
	{
		m_gl.deleteTextures(1, &sourceTexture);
		throw;
	}
}